

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::print_pose(Epnp *this,double (*R) [3],double *t)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>((*R)[0]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((*R)[1]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>((*R)[2]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(*t);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(R[1][0]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(R[1][1]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(R[1][2]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(t[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(R[2][0]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(R[2][1]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(R[2][2]);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(t[2]);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::print_pose(
    const double R[3][3],
    const double t[3])
{
  cout << R[0][0] << " " << R[0][1] << " " << R[0][2] << " " << t[0] << endl;
  cout << R[1][0] << " " << R[1][1] << " " << R[1][2] << " " << t[1] << endl;
  cout << R[2][0] << " " << R[2][1] << " " << R[2][2] << " " << t[2] << endl;
}